

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssertionExpr.cpp
# Opt level: O3

NondegeneracyCheckResult * __thiscall
slang::ast::BinaryAssertionExpr::checkNondegeneracyImpl
          (NondegeneracyCheckResult *__return_storage_ptr__,BinaryAssertionExpr *this)

{
  SourceRange *visitor;
  SyntaxNode *this_00;
  underlying_type uVar1;
  SourceLocation SVar2;
  SequenceLengthVisitor *pSVar3;
  NondegeneracyCheckResult *pNVar4;
  optional<slang::ast::SequenceRange> oVar5;
  _Optional_base<slang::ast::SequenceRange,_true,_true> _Var6;
  SourceRange SVar7;
  NondegeneracyCheckResult rightNondegen;
  NondegeneracyCheckResult leftNondegen;
  underlying_type local_8c;
  uint local_88;
  NondegeneracyCheckResult local_80;
  NondegeneracyCheckResult local_60;
  Token local_40;
  
  AssertionExpr::checkNondegeneracy(&local_60,this->left);
  AssertionExpr::checkNondegeneracy(&local_80,this->right);
  (__return_storage_ptr__->status).m_bits = 0;
  (__return_storage_ptr__->noMatchRange).startLoc = (SourceLocation)0x0;
  (__return_storage_ptr__->noMatchRange).endLoc = (SourceLocation)0x0;
  __return_storage_ptr__->isAlwaysFalse = false;
  if (Within < this->op) {
    return __return_storage_ptr__;
  }
  visitor = &__return_storage_ptr__->noMatchRange;
  switch(this->op) {
  case And:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) == 0) {
      uVar1 = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar1 = 5;
    }
    if (((local_80.status.m_bits | local_60.status.m_bits) & 4) == 0) {
      return __return_storage_ptr__;
    }
    pNVar4 = &local_60;
    if ((local_60.status.m_bits & 4) == 0) {
      pNVar4 = &local_80;
    }
    (__return_storage_ptr__->status).m_bits = uVar1;
    SVar2 = (pNVar4->noMatchRange).endLoc;
    visitor->startLoc = (pNVar4->noMatchRange).startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = SVar2;
    local_80.isAlwaysFalse = pNVar4->isAlwaysFalse;
    break;
  case Or:
    uVar1 = 4;
    if (((local_80.status.m_bits | local_60.status.m_bits) & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar1 = 5;
    }
    if ((local_60.status.m_bits & 4) == 0 || (local_80.status.m_bits & 4) == 0) {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->status).m_bits = uVar1;
    visitor->startLoc = local_60.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_60.noMatchRange.endLoc;
    local_80.isAlwaysFalse = local_60.isAlwaysFalse;
    break;
  case Intersect:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) == 0) {
      local_8c = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      local_8c = 5;
    }
    pSVar3 = (SequenceLengthVisitor *)visitor;
    oVar5 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                      (this->left,(SequenceLengthVisitor *)visitor);
    local_88 = oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>(this->right,pSVar3);
    if ((local_60.status.m_bits & 4) == 0) {
      if ((local_80.status.m_bits & 4) != 0) {
LAB_004b2605:
        (__return_storage_ptr__->status).m_bits = local_8c;
        visitor->startLoc = local_80.noMatchRange.startLoc;
        (__return_storage_ptr__->noMatchRange).endLoc = local_80.noMatchRange.endLoc;
        break;
      }
      if ((oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if ((((undefined1  [16])
            oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
            super__Optional_payload_base<slang::ast::SequenceRange> & (undefined1  [16])0x1) ==
           (undefined1  [16])0x0) ||
         (_Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_
          <= oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_4_))
      goto LAB_004b2519;
LAB_004b2598:
      (__return_storage_ptr__->status).m_bits = local_8c;
      this_00 = this->left->syntax;
      if (this_00 == (SyntaxNode *)0x0) {
        return __return_storage_ptr__;
      }
      if (this->right->syntax == (SyntaxNode *)0x0) {
        return __return_storage_ptr__;
      }
      local_40 = slang::syntax::SyntaxNode::getFirstToken(this_00);
      SVar2 = parsing::Token::location(&local_40);
      SVar7 = slang::syntax::SyntaxNode::sourceRange(this->right->syntax);
      (__return_storage_ptr__->noMatchRange).startLoc = SVar2;
      (__return_storage_ptr__->noMatchRange).endLoc = SVar7.endLoc;
      local_80.isAlwaysFalse = false;
      break;
    }
    goto LAB_004b25f0;
  case Throughout:
    uVar1 = 4;
    if ((local_80.status.m_bits & 1) != 0) {
      (__return_storage_ptr__->status).m_bits = 1;
      uVar1 = 5;
    }
    if ((local_80.status.m_bits & 4) == 0) {
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->status).m_bits = uVar1;
    visitor->startLoc = local_80.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_80.noMatchRange.endLoc;
    break;
  case Within:
    if ((local_80.status.m_bits & local_60.status.m_bits & 1) == 0) {
      local_8c = 4;
    }
    else {
      (__return_storage_ptr__->status).m_bits = 1;
      local_8c = 5;
    }
    pSVar3 = (SequenceLengthVisitor *)visitor;
    oVar5 = AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>
                      (this->left,(SequenceLengthVisitor *)visitor);
    local_88 = oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
               super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._0_4_;
    _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> =
         (_Optional_payload<slang::ast::SequenceRange,_true,_true,_true>)
         AssertionExpr::visit<(anonymous_namespace)::SequenceLengthVisitor>(this->right,pSVar3);
    if ((local_60.status.m_bits & 4) == 0) {
      if ((local_80.status.m_bits & 4) != 0) goto LAB_004b2605;
      if ((oVar5.super__Optional_base<slang::ast::SequenceRange,_true,_true>._M_payload.
           super__Optional_payload_base<slang::ast::SequenceRange>._8_8_ >> 0x20 & 1) == 0) {
        return __return_storage_ptr__;
      }
      if (((undefined1  [16])
           _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x100000000) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
LAB_004b2519:
      if (((undefined1  [16])
           _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange> &
          (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        return __return_storage_ptr__;
      }
      if (local_88 <=
          _Var6._M_payload.super__Optional_payload_base<slang::ast::SequenceRange>._M_payload._4_4_)
      {
        return __return_storage_ptr__;
      }
      goto LAB_004b2598;
    }
LAB_004b25f0:
    (__return_storage_ptr__->status).m_bits = local_8c;
    visitor->startLoc = local_60.noMatchRange.startLoc;
    (__return_storage_ptr__->noMatchRange).endLoc = local_60.noMatchRange.endLoc;
    local_80.isAlwaysFalse = local_60.isAlwaysFalse;
  }
  __return_storage_ptr__->isAlwaysFalse = local_80.isAlwaysFalse;
  return __return_storage_ptr__;
}

Assistant:

AssertionExpr::NondegeneracyCheckResult BinaryAssertionExpr::checkNondegeneracyImpl() const {
    const auto leftNondegen = left.checkNondegeneracy();
    const auto rightNondegen = right.checkNondegeneracy();
    const auto leftNondegenSt = leftNondegen.status;
    const auto rightNondegenSt = rightNondegen.status;
    const bool leftAdmitsEmpty = leftNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool rightAdmitsEmpty = rightNondegenSt.has(NondegeneracyStatus::AdmitsEmpty);
    const bool leftAdmitsNoMatch = leftNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);
    const bool rightAdmitsNoMatch = rightNondegenSt.has(NondegeneracyStatus::AdmitsNoMatch);

    NondegeneracyCheckResult res;
    auto joinNoMatchReasons = [&] {
        if (leftAdmitsNoMatch) {
            res.noMatchRange = leftNondegen.noMatchRange;
            res.isAlwaysFalse = leftNondegen.isAlwaysFalse;
        }
        else if (rightAdmitsNoMatch) {
            res.noMatchRange = rightNondegen.noMatchRange;
            res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
        }
        else if (left.syntax && right.syntax) {
            res.noMatchRange = {left.syntax->getFirstToken().location(),
                                right.syntax->sourceRange().end()};
            res.isAlwaysFalse = false;
        }
    };

    switch (op) {
        case BinaryAssertionOperator::Or: {
            if (leftAdmitsEmpty || rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `or` full sequence is no match if and only if both parts are no match.
            if (leftAdmitsNoMatch && rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::And: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `and` full sequence is no match if and only if any part is no match.
            if (leftAdmitsNoMatch || rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Intersect: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `intersect` full sequence is no match if both parts don't have any
            // possible overlap in their length ranges.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canIntersect(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Within: {
            if (leftAdmitsEmpty && rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `within` full sequence is no match if left side delay range is within
            // right side delay range.
            const auto leftLen = left.computeSequenceLength();
            const auto rightLen = right.computeSequenceLength();
            if (leftAdmitsNoMatch || rightAdmitsNoMatch ||
                (leftLen && rightLen && !leftLen->canBeWithin(*rightLen))) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                joinNoMatchReasons();
            }
            break;
        }
        case BinaryAssertionOperator::Throughout: {
            if (rightAdmitsEmpty)
                res.status |= NondegeneracyStatus::AdmitsEmpty;

            // In case of `throughout` full sequence is no match if right part is no match
            if (rightAdmitsNoMatch) {
                res.status |= NondegeneracyStatus::AdmitsNoMatch;
                res.noMatchRange = rightNondegen.noMatchRange;
                res.isAlwaysFalse = rightNondegen.isAlwaysFalse;
            }
            break;
        }
        default:
            break;
    }

    return res;
}